

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_args.c
# Opt level: O0

REF_STATUS ref_args_find(REF_INT n,char **args,char *target,REF_INT *pos)

{
  int iVar1;
  int local_2c;
  REF_INT i;
  REF_INT *pos_local;
  char *target_local;
  char **args_local;
  REF_INT n_local;
  
  *pos = -1;
  local_2c = 0;
  while( true ) {
    if (n <= local_2c) {
      return 5;
    }
    iVar1 = strcmp(target,args[local_2c]);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  *pos = local_2c;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_args_find(REF_INT n, char **args, const char *target,
                                 REF_INT *pos) {
  REF_INT i;

  *pos = REF_EMPTY;

  for (i = 0; i < n; i++) {
    if (0 == strcmp(target, args[i])) {
      *pos = i;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}